

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
cppqc::detail::ChooseStatelessGenerator<int>::shrink
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          ChooseStatelessGenerator<int> *this,int x)

{
  uint uVar1;
  uint uVar2;
  uint local_20;
  uint local_1c;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve
            (__return_storage_ptr__,(long)x - (long)this->m_min);
  local_1c = this->m_min;
  local_20 = this->m_max;
  uVar1 = -local_1c;
  if (0 < (int)local_1c) {
    uVar1 = local_1c;
  }
  uVar2 = -local_20;
  if (0 < (int)local_20) {
    uVar2 = local_20;
  }
  if (uVar2 < uVar1) {
    for (; local_20 != x; local_20 = local_20 - 1) {
      std::vector<int,_std::allocator<int>_>::push_back
                (__return_storage_ptr__,(value_type_conflict *)&local_20);
    }
  }
  else {
    for (; local_1c != x; local_1c = local_1c + 1) {
      std::vector<int,_std::allocator<int>_>::push_back
                (__return_storage_ptr__,(value_type_conflict *)&local_1c);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Integer> shrink(Integer x) const {
    std::vector<Integer> ret;
    ret.reserve(x - m_min);
    if (abs(m_min) <= abs(m_max)) {
      for (Integer i = m_min; i != x; ++i)
        ret.push_back(i);
    } else {
      for (Integer i = m_max; i != x; --i)
        ret.push_back(i);
    }
    return ret;
  }